

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O1

void __thiscall
entt::basic_registry<entt::entity>::pool_handler<Swarm>::pool_handler
          (pool_handler<Swarm> *this,pool_handler<Swarm> *param_1)

{
  sparse_set<entt::entity>::sparse_set
            ((sparse_set<entt::entity> *)this,(sparse_set<entt::entity> *)param_1);
  (this->super_storage<entt::entity,_Swarm>).super_basic_storage<entt::entity,_Swarm,_void>.
  super_sparse_set<entt::entity>._vptr_sparse_set = (_func_int **)&PTR__basic_storage_007fcf08;
  std::vector<Swarm,_std::allocator<Swarm>_>::vector
            (&(this->super_storage<entt::entity,_Swarm>).
              super_basic_storage<entt::entity,_Swarm,_void>.instances,
             &(param_1->super_storage<entt::entity,_Swarm>).
              super_basic_storage<entt::entity,_Swarm,_void>.instances);
  (this->super_storage<entt::entity,_Swarm>).super_basic_storage<entt::entity,_Swarm,_void>.
  super_sparse_set<entt::entity>._vptr_sparse_set = (_func_int **)&PTR__pool_handler_007fce98;
  this->group = param_1->group;
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>_>_>
  ::vector(&(this->construction).calls,&(param_1->construction).calls);
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>_>_>
  ::vector(&(this->update).calls,&(param_1->update).calls);
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&)>_>_>
  ::vector(&(this->destruction).calls,&(param_1->destruction).calls);
  return;
}

Assistant:

pool_handler() ENTT_NOEXCEPT = default;